

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void __thiscall
matchit::impl::Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Id(Id<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  anon_class_1_0_00000001 local_41;
  undefined4 local_40;
  _Variadic_union<std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_38;
  ulong local_18;
  
  local_40 = 0;
  local_38._M_rest._M_rest =
       (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        )0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_38._24_8_ = 0;
  local_18 = 0;
  *(undefined4 *)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
       = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                     *)((long)&(this->mBlock).
                               super__Variant_base<matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                               .
                               super__Move_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
                               .
                               super__Copy_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
                               .
                               super__Move_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
                               .
                               super__Copy_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
                               .
                               super__Variant_storage_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
                       + 8),(_Move_ctor_base<false,_std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                             *)&local_38);
  *(__index_type *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>,_matchit::impl::IdBlock<std::__cxx11::basic_string<char>_>_*>
   + 0x30) = '\0';
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_&>
    ::_S_vtable._M_arr[local_18 & 0xff]._M_data)
            (&local_41,
             (variant<std::monostate,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              *)&local_38);
  return;
}

Assistant:

constexpr Id() = default;